

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  __uid_t _Var2;
  __uid_t _Var3;
  int *piVar4;
  long lVar5;
  char *pcVar6;
  fd_set *__arr;
  uint __i;
  long tmpint;
  char *envname;
  int i;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  argv_local._0_4_ = argc;
  if ((1 < argc) && (*argv[1] != '-')) {
    strncpy(sysout_name_first_arg,argv[1],0x1000);
  }
  read_Xoption((int *)&argv_local,argv);
  save_argc = (int)argv_local;
  envname._4_4_ = 1;
  save_argv = argv;
  if ((argv[1] != (char *)0x0) &&
     ((iVar1 = strcmp(argv[1],"-info"), iVar1 == 0 || (iVar1 = strcmp(argv[1],"-INFO"), iVar1 == 0))
     )) {
    print_info_lines();
    exit(0);
  }
  if ((argv[1] != (char *)0x0) &&
     ((iVar1 = strcmp(argv[1],"-help"), iVar1 == 0 || (iVar1 = strcmp(argv[1],"-HELP"), iVar1 == 0))
     )) {
    fprintf(_stderr,"%s%s",helpstring,nethubHelpstring);
    exit(0);
  }
  for (; envname._4_4_ < (int)argv_local; envname._4_4_ = envname._4_4_ + 1) {
    iVar1 = strcmp(argv[envname._4_4_],"-sysout");
    if (iVar1 == 0) {
      envname._4_4_ = envname._4_4_ + 1;
      if (envname._4_4_ < (int)argv_local) {
        strncpy(sysout_name_cl,argv[envname._4_4_],0x1000);
      }
    }
    else {
      iVar1 = strcmp(argv[envname._4_4_],"-timer");
      if (iVar1 == 0) {
        envname._4_4_ = envname._4_4_ + 1;
        if ((int)argv_local <= envname._4_4_) {
          fprintf(_stderr,"Missing argument after -timer\n");
          exit(1);
        }
        piVar4 = __errno_location();
        *piVar4 = 0;
        lVar5 = strtol(argv[envname._4_4_],(char **)0x0,10);
        piVar4 = __errno_location();
        if ((*piVar4 != 0) || (lVar5 < 1)) {
          fprintf(_stderr,"Bad value for -timer (integer > 0)\n");
          exit(1);
        }
        TIMER_INTERVAL = (int)lVar5;
      }
      else {
        iVar1 = strcmp(argv[envname._4_4_],"-m");
        if (iVar1 == 0) {
          envname._4_4_ = envname._4_4_ + 1;
          if ((int)argv_local <= envname._4_4_) {
            fprintf(_stderr,"Missing argument after -m\n");
            exit(1);
          }
          piVar4 = __errno_location();
          *piVar4 = 0;
          lVar5 = strtol(argv[envname._4_4_],(char **)0x0,10);
          piVar4 = __errno_location();
          if ((*piVar4 != 0) || (lVar5 < 1)) {
            fprintf(_stderr,"Bad value for -m (integer > 0)\n");
            exit(1);
          }
          sysout_size = (uint)lVar5;
        }
        else {
          iVar1 = strcmp(argv[envname._4_4_],"-NF");
          if (iVar1 == 0) {
            please_fork = 0;
          }
          else {
            iVar1 = strcmp(argv[envname._4_4_],"-INIT");
            if (iVar1 == 0) {
              for_makeinit = 1;
            }
            else {
              iVar1 = strcmp(argv[envname._4_4_],"-E");
              if ((iVar1 != 0) && (iVar1 = strcmp(argv[envname._4_4_],"-xpages"), iVar1 == 0)) {
                envname._4_4_ = envname._4_4_ + 1;
                if ((int)argv_local <= envname._4_4_) {
                  fprintf(_stderr,"Missing argument after -xpages\n");
                  exit(1);
                }
                piVar4 = __errno_location();
                *piVar4 = 0;
                lVar5 = strtol(argv[envname._4_4_],(char **)0x0,10);
                piVar4 = __errno_location();
                if ((*piVar4 != 0) || (lVar5 < 1)) {
                  fprintf(_stderr,"Bad value for -xpages (integer > 0)\n");
                  exit(1);
                }
                maxpages = (uint)lVar5;
              }
            }
          }
        }
      }
    }
  }
  if (sysout_name_cl[0] == '\0') {
    if (sysout_name_first_arg[0] == '\0') {
      pcVar6 = getenv("LDESRCESYSOUT");
      if (pcVar6 == (char *)0x0) {
        pcVar6 = getenv("LDESOURCESYSOUT");
        if (pcVar6 == (char *)0x0) {
          if (sysout_name_xrm[0] == '\0') {
            pcVar6 = getenv("HOME");
            if (pcVar6 != (char *)0x0) {
              strncpy(sysout_name,pcVar6,0x1000);
              strncat(sysout_name,"/lisp.virtualmem",0xfef);
            }
          }
          else {
            strncpy(sysout_name,sysout_name_xrm,0x1000);
          }
        }
        else {
          strncpy(sysout_name,pcVar6,0x1000);
        }
      }
      else {
        strncpy(sysout_name,pcVar6,0x1000);
      }
    }
    else {
      strncpy(sysout_name,sysout_name_first_arg,0x1000);
    }
  }
  else {
    strncpy(sysout_name,sysout_name_cl,0x1000);
  }
  if ((sysout_name[0] == '\0') || (iVar1 = access(sysout_name,4), iVar1 != 0)) {
    perror("Couldn\'t find a sysout to run");
    fprintf(_stderr,"Looking for: %s\n",sysout_name);
    fprintf(_stderr,"%s%s",helpstring,nethubHelpstring);
    exit(1);
  }
  _Var2 = getuid();
  _Var3 = geteuid();
  if (_Var2 != _Var3) {
    fprintf(_stderr,"Effective user is not real user.  Resetting uid\n");
    _Var2 = getuid();
    iVar1 = setuid(_Var2);
    if (iVar1 == -1) {
      fprintf(_stderr,"Unable to reset user id to real user id\n");
      exit(1);
    }
  }
  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
    LispReadFds.__fds_bits[__arr._4_4_] = 0;
  }
  iVar1 = FindUnixPipes();
  if ((iVar1 != 0) && (please_fork != 0)) {
    fprintf(_stderr,"Failed to find UNIXCOMM file handles; no processes\n");
  }
  make_dsp_instance(currentdsp,(char *)0x0,0,0,1);
  sysout_size = sysout_loader(sysout_name,sysout_size);
  build_lisp_map();
  init_ifpage(sysout_size);
  init_iopage();
  init_miscstats();
  init_storage();
  set_cursor();
  iVar1 = init_finfo();
  if (iVar1 != 0) {
    if (for_makeinit == 0) {
      init_keyboard(0);
    }
    start_lisp();
    return 0;
  }
  fprintf(_stderr,"Cannot allocate internal data.\n");
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{
  int i;
  char *envname;
  extern int TIMER_INTERVAL;
  extern fd_set LispReadFds;
  long tmpint;

#ifdef MAIKO_ENABLE_FOREIGN_FUNCTION_INTERFACE
  if (dld_find_executable(argv[0]) == 0) {
    perror("Name of executable not found.");
  } else if (dld_init(dld_find_executable(argv[0])) != 0) {
    dld_perror("Can't init DLD.");
  }
#endif /* MAIKO_ENABLE_FOREIGN_FUNCTION_INTERFACE */

#ifdef PROFILE
  moncontrol(0); /* initially stop sampling */
#endif           /* PROFILE */

  //
  //
  //  Process Command Line Arguments
  //
  //

  // First check if the first argument is a sysout name
  // and save it away if it is in case the X windows
  // arg processing changes argc/argv
  if (argc > 1 && argv[1][0] != '-') {
    strncpy(sysout_name_first_arg, argv[1], MAXPATHLEN);
  }


#ifdef XWINDOW
  read_Xoption(&argc, argv);
#endif /* XWINDOW */

  save_argc = argc;
  save_argv = argv;

  i = 1;

  if (argv[i] && ((strcmp(argv[i], "-info") == 0) || (strcmp(argv[i], "-INFO") == 0))) {
    print_info_lines();
    exit(0);
  }

  if (argv[i] && ((strcmp(argv[i], "-help") == 0) || (strcmp(argv[i], "-HELP") == 0))) {
    (void)fprintf(stderr, "%s%s", helpstring, nethubHelpstring);
    exit(0);
  }


  for (; i < argc; i += 1) { /* step by 1 in case of typo */

   // NOTE:  in the case of X Windows, some of the args being checked for in this loop
   // have already been processed (and removed from argv) by the call to read_Xoption()
   // above.  (See readXoption() in xrdopt.c)

   /* Check for -sysout arg */
    if (!strcmp(argv[i], "-sysout")) {
      if (argc > ++i) {
        strncpy(sysout_name_cl, argv[i], MAXPATHLEN);
      }
    }

    /* -timer and -m are undocumented and somewhat dangerous... */

    else if (!strcmp(argv[i], "-timer")) { /**** timer interval	****/
      if (argc > ++i) {
        errno = 0;
        tmpint = strtol(argv[i], (char **)NULL, 10);
        if (errno == 0 && tmpint > 0) {
          TIMER_INTERVAL = tmpint;
        } else {
          (void)fprintf(stderr, "Bad value for -timer (integer > 0)\n");
          exit(1);
        }
      } else {
        (void)fprintf(stderr, "Missing argument after -timer\n");
        exit(1);
      }
    }

    else if (!strcmp(argv[i], "-m")) { /**** sysout size	****/
      if (argc > ++i) {
        errno = 0;
        tmpint = strtol(argv[i], (char **)NULL, 10);
        if (errno == 0 && tmpint > 0) {
          sysout_size = (unsigned)tmpint;
        } else {
          (void)fprintf(stderr, "Bad value for -m (integer > 0)\n");
          exit(1);
        }
      } else {
        (void)fprintf(stderr, "Missing argument after -m\n");
        exit(1);
      }
    }

    else if (!strcmp(argv[i], "-NF")) { /****  Don't fork (for dbxing)	****/
      please_fork = 0;
    }

    else if (!strcmp(argv[i], "-INIT")) { /*** init sysout, no packaged */
      for_makeinit = 1;
    }
#ifdef DOS
    else if ((strcmp(argv[i], "-vga") == 0) || (strcmp(argv[i], "-VGA") == 0)) {
      dosdisplaymode = 1;
    } else if ((strcmp(argv[i], "-vesa102") == 0) || (strcmp(argv[i], "-VESA102") == 0)) {
      dosdisplaymode = 0x102;
    }